

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int copyEntityTable(XML_Parser oldParser,HASH_TABLE *newTable,STRING_POOL *newPool,
                   HASH_TABLE *oldTable)

{
  XML_Char XVar1;
  NAMED *pNVar2;
  XML_Bool XVar3;
  XML_Char *pXVar4;
  NAMED *pNVar5;
  NAMED **ppNVar6;
  int iVar7;
  KEY pXVar8;
  NAMED **ppNVar9;
  KEY local_50;
  XML_Char *local_48;
  
  ppNVar9 = oldTable->v;
  if (ppNVar9 == (NAMED **)0x0) {
    ppNVar6 = (NAMED **)0x0;
  }
  else {
    ppNVar6 = ppNVar9 + oldTable->size;
  }
  local_50 = (KEY)0x0;
  local_48 = (XML_Char *)0x0;
  do {
    do {
      if (ppNVar9 == ppNVar6) {
        return 1;
      }
      pNVar2 = *ppNVar9;
      ppNVar9 = ppNVar9 + 1;
    } while (pNVar2 == (NAMED *)0x0);
    pXVar4 = poolCopyString(newPool,pNVar2->name);
    if (pXVar4 == (XML_Char *)0x0) {
      return 0;
    }
    pNVar5 = lookup(oldParser,newTable,pXVar4,0x40);
    if (pNVar5 == (NAMED *)0x0) {
      return 0;
    }
    if (pNVar2[3].name == (XML_Char *)0x0) {
      pXVar8 = pNVar2[1].name;
      iVar7 = *(int *)&pNVar2[2].name;
      if ((newPool->ptr == (XML_Char *)0x0) && (XVar3 = poolGrow(newPool), XVar3 == '\0')) {
        return 0;
      }
      if (0 < iVar7) {
        iVar7 = iVar7 + 1;
        do {
          pXVar4 = newPool->ptr;
          if (pXVar4 == newPool->end) {
            XVar3 = poolGrow(newPool);
            if (XVar3 == '\0') {
              return 0;
            }
            pXVar4 = newPool->ptr;
          }
          XVar1 = *pXVar8;
          newPool->ptr = pXVar4 + 1;
          *pXVar4 = XVar1;
          pXVar8 = pXVar8 + 1;
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
      }
      pXVar8 = newPool->start;
      newPool->start = newPool->ptr;
      if (pXVar8 == (KEY)0x0) {
        return 0;
      }
      pNVar5[1].name = pXVar8;
      *(undefined4 *)&pNVar5[2].name = *(undefined4 *)&pNVar2[2].name;
    }
    else {
      pXVar4 = poolCopyString(newPool,pNVar2[3].name);
      if (pXVar4 == (XML_Char *)0x0) {
        return 0;
      }
      pNVar5[3].name = pXVar4;
      pXVar4 = pNVar2[4].name;
      if (pXVar4 != (XML_Char *)0x0) {
        if ((pXVar4 != local_48) &&
           (local_50 = poolCopyString(newPool,pXVar4), local_48 = pXVar4,
           local_50 == (XML_Char *)0x0)) {
          return 0;
        }
        pNVar5[4].name = local_50;
      }
      if (pNVar2[5].name != (XML_Char *)0x0) {
        pXVar4 = poolCopyString(newPool,pNVar2[5].name);
        if (pXVar4 == (XML_Char *)0x0) {
          return 0;
        }
        pNVar5[5].name = pXVar4;
      }
    }
    if (pNVar2[6].name != (XML_Char *)0x0) {
      pXVar4 = poolCopyString(newPool,pNVar2[6].name);
      if (pXVar4 == (XML_Char *)0x0) {
        return 0;
      }
      pNVar5[6].name = pXVar4;
    }
    *(undefined1 *)((long)&pNVar5[7].name + 1) = *(undefined1 *)((long)&pNVar2[7].name + 1);
    *(undefined1 *)((long)&pNVar5[7].name + 2) = *(undefined1 *)((long)&pNVar2[7].name + 2);
  } while( true );
}

Assistant:

static int
copyEntityTable(XML_Parser oldParser, HASH_TABLE *newTable,
                STRING_POOL *newPool, const HASH_TABLE *oldTable) {
  HASH_TABLE_ITER iter;
  const XML_Char *cachedOldBase = NULL;
  const XML_Char *cachedNewBase = NULL;

  hashTableIterInit(&iter, oldTable);

  for (;;) {
    ENTITY *newE;
    const XML_Char *name;
    const ENTITY *oldE = (ENTITY *)hashTableIterNext(&iter);
    if (! oldE)
      break;
    name = poolCopyString(newPool, oldE->name);
    if (! name)
      return 0;
    newE = (ENTITY *)lookup(oldParser, newTable, name, sizeof(ENTITY));
    if (! newE)
      return 0;
    if (oldE->systemId) {
      const XML_Char *tem = poolCopyString(newPool, oldE->systemId);
      if (! tem)
        return 0;
      newE->systemId = tem;
      if (oldE->base) {
        if (oldE->base == cachedOldBase)
          newE->base = cachedNewBase;
        else {
          cachedOldBase = oldE->base;
          tem = poolCopyString(newPool, cachedOldBase);
          if (! tem)
            return 0;
          cachedNewBase = newE->base = tem;
        }
      }
      if (oldE->publicId) {
        tem = poolCopyString(newPool, oldE->publicId);
        if (! tem)
          return 0;
        newE->publicId = tem;
      }
    } else {
      const XML_Char *tem
          = poolCopyStringN(newPool, oldE->textPtr, oldE->textLen);
      if (! tem)
        return 0;
      newE->textPtr = tem;
      newE->textLen = oldE->textLen;
    }
    if (oldE->notation) {
      const XML_Char *tem = poolCopyString(newPool, oldE->notation);
      if (! tem)
        return 0;
      newE->notation = tem;
    }
    newE->is_param = oldE->is_param;
    newE->is_internal = oldE->is_internal;
  }
  return 1;
}